

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O1

Log * __thiscall FIX::FileLogFactory::create(FileLogFactory *this)

{
  Dictionary *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  bool bVar4;
  FileLog *this_01;
  string backupPath;
  string path;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar3 = this->m_globalLogCount;
  this->m_globalLogCount = iVar3 + 1;
  if (iVar3 < 1) {
    if ((this->m_path)._M_string_length == 0) {
      paVar1 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FileLogPath","");
      this_00 = &(this->m_settings).m_defaults;
      Dictionary::getString(&local_70,this_00,&local_b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      paVar2 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"FileLogBackupPath","");
      bVar4 = Dictionary::has(this_00,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"FileLogBackupPath","");
        Dictionary::getString(&local_90,this_00,&local_50,false);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      this_01 = (FileLog *)operator_new(0x488);
      FileLog::FileLog(this_01,&local_70,&local_b0);
      this->m_globalLog = (Log *)this_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_01 = (FileLog *)operator_new(0x488);
      FileLog::FileLog(this_01,&this->m_path);
    }
  }
  else {
    this_01 = (FileLog *)this->m_globalLog;
  }
  return &this_01->super_Log;
}

Assistant:

Log* FileLogFactory::create()
{
  if ( ++m_globalLogCount > 1 ) return m_globalLog;

  if ( m_path.size() ) return new FileLog(m_path);

  try
  {

    const Dictionary& settings = m_settings.get();
    std::string path = settings.getString(FILE_LOG_PATH);
    std::string backupPath = path;

    if ( settings.has( FILE_LOG_BACKUP_PATH ) )
      backupPath = settings.getString( FILE_LOG_BACKUP_PATH );

    return m_globalLog = new FileLog( path, backupPath );

  }
  catch( ConfigError& )
  {
    m_globalLogCount--;
    throw;
  }
}